

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O0

void deqp::gls::StateQueryUtil::queryProgramState
               (ResultCollector *result,CallLogWrapper *gl,QueryType type,GLuint program,
               GLenum pname,QueriedState *state)

{
  bool bVar1;
  int *piVar2;
  int (*paiVar3) [3];
  QueriedState local_b8;
  undefined1 local_8c [8];
  StateQueryMemoryWriteGuard<int[3]> value_1;
  undefined1 local_3c [8];
  StateQueryMemoryWriteGuard<int> value;
  QueriedState *state_local;
  GLenum pname_local;
  GLuint program_local;
  QueryType type_local;
  CallLogWrapper *gl_local;
  ResultCollector *result_local;
  
  value._4_8_ = state;
  if (type == QUERY_PROGRAM_INTEGER) {
    StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<int> *)local_3c);
    piVar2 = StateQueryMemoryWriteGuard<int>::operator&((StateQueryMemoryWriteGuard<int> *)local_3c)
    ;
    glu::CallLogWrapper::glGetProgramiv(gl,program,pname,piVar2);
    bVar1 = checkError(result,gl,"glGetProgramiv");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<int>::verifyValidity
                          ((StateQueryMemoryWriteGuard<int> *)local_3c,result), bVar1)) {
      piVar2 = StateQueryMemoryWriteGuard::operator_cast_to_int_
                         ((StateQueryMemoryWriteGuard *)local_3c);
      QueriedState::QueriedState((QueriedState *)(value_1.m_postguard + 1),*piVar2);
      memcpy((void *)value._4_8_,value_1.m_postguard + 1,0x28);
    }
  }
  else if (type == QUERY_PROGRAM_INTEGER_VEC3) {
    StateQueryMemoryWriteGuard<int[3]>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<int[3]> *)local_8c);
    paiVar3 = StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                        ((StateQueryMemoryWriteGuard *)local_8c);
    glu::CallLogWrapper::glGetProgramiv(gl,program,pname,*paiVar3);
    bVar1 = checkError(result,gl,"glGetProgramiv");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<int[3]>::verifyValidity
                          ((StateQueryMemoryWriteGuard<int[3]> *)local_8c,result), bVar1)) {
      paiVar3 = StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                          ((StateQueryMemoryWriteGuard *)local_8c);
      QueriedState::QueriedState(&local_b8,(GLIntVec3 *)paiVar3);
      memcpy((void *)value._4_8_,&local_b8,0x28);
    }
  }
  return;
}

Assistant:

void queryProgramState (tcu::ResultCollector& result, glu::CallLogWrapper& gl, QueryType type, glw::GLuint program, glw::GLenum pname, QueriedState& state)
{
	switch (type)
	{
		case QUERY_PROGRAM_INTEGER:
		{
			StateQueryMemoryWriteGuard<glw::GLint> value;
			gl.glGetProgramiv(program, pname, &value);

			if (!checkError(result, gl, "glGetProgramiv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_PROGRAM_INTEGER_VEC3:
		{
			StateQueryMemoryWriteGuard<glw::GLint[3]> value;
			gl.glGetProgramiv(program, pname, value);

			if (!checkError(result, gl, "glGetProgramiv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		default:
			DE_ASSERT(false);
	}
}